

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OStreamReporter.cc
# Opt level: O3

void __thiscall cppmetrics::OStreamReporter::report(OStreamReporter *this)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  double dVar3;
  shared_ptr<cppmetrics::Snapshot> snapshot;
  Histogram local_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>_>_>_>
  local_60;
  
  Registry::get_counters_abi_cxx11_
            ((MMap<Counter> *)&local_60,
             (this->m_registry).super___shared_ptr<cppmetrics::Registry,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    do {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (this->m_output,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
      Counter::get_count(*(Counter **)(p_Var2 + 2));
      poVar1 = std::ostream::_M_insert<long>((long)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>_>_>_>
  ::~_Rb_tree(&local_60);
  Registry::get_gauges_abi_cxx11_
            ((MMap<Gauge> *)&local_60,
             (this->m_registry).super___shared_ptr<cppmetrics::Registry,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>_>_>_>
               *)&local_60);
  Registry::get_meters_abi_cxx11_
            ((MMap<Meter> *)&local_60,
             (this->m_registry).super___shared_ptr<cppmetrics::Registry,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    do {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (this->m_output,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,".count\t",7);
      Meter::get_count(*(Meter **)(p_Var2 + 2));
      poVar1 = std::ostream::_M_insert<long>((long)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (this->m_output,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,".mean\t",6);
      dVar3 = Meter::get_mean_rate(*(Meter **)(p_Var2 + 2));
      poVar1 = std::ostream::_M_insert<double>(dVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (this->m_output,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,".m1\t",4);
      dVar3 = Meter::get_m1_rate(*(Meter **)(p_Var2 + 2));
      poVar1 = std::ostream::_M_insert<double>(dVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (this->m_output,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,".m5\t",4);
      dVar3 = Meter::get_m5_rate(*(Meter **)(p_Var2 + 2));
      poVar1 = std::ostream::_M_insert<double>(dVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (this->m_output,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,".m15\t",5);
      dVar3 = Meter::get_m15_rate(*(Meter **)(p_Var2 + 2));
      poVar1 = std::ostream::_M_insert<double>(dVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>_>_>_>
               *)&local_60);
  Registry::get_histograms_abi_cxx11_
            ((MMap<Histogram> *)&local_60,
             (this->m_registry).super___shared_ptr<cppmetrics::Registry,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    do {
      Histogram::get_snapshot(&local_70);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (this->m_output,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,".count\t",7);
      Histogram::get_count(*(Histogram **)(p_Var2 + 2));
      poVar1 = std::ostream::_M_insert<long>((long)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (this->m_output,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,".p75\t",5);
      dVar3 = (double)(**(code **)(*(long *)local_70.m_counter.super___atomic_base<long>._M_i + 0x50
                                  ))();
      poVar1 = std::ostream::_M_insert<double>(dVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (this->m_output,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,".p95\t",5);
      dVar3 = (double)(**(code **)(*(long *)local_70.m_counter.super___atomic_base<long>._M_i + 0x58
                                  ))();
      poVar1 = std::ostream::_M_insert<double>(dVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (this->m_output,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,".p99\t",5);
      dVar3 = (double)(**(code **)(*(long *)local_70.m_counter.super___atomic_base<long>._M_i + 0x68
                                  ))();
      poVar1 = std::ostream::_M_insert<double>(dVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      if (local_70.m_reservoir._M_t.
          super___uniq_ptr_impl<cppmetrics::Reservoir,_std::default_delete<cppmetrics::Reservoir>_>.
          _M_t.
          super__Tuple_impl<0UL,_cppmetrics::Reservoir_*,_std::default_delete<cppmetrics::Reservoir>_>
          .super__Head_base<0UL,_cppmetrics::Reservoir_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<cppmetrics::Reservoir,_std::default_delete<cppmetrics::Reservoir>_>)0x0)
      {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_70.m_reservoir._M_t.
                   super___uniq_ptr_impl<cppmetrics::Reservoir,_std::default_delete<cppmetrics::Reservoir>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cppmetrics::Reservoir_*,_std::default_delete<cppmetrics::Reservoir>_>
                   .super__Head_base<0UL,_cppmetrics::Reservoir_*,_false>._M_head_impl);
      }
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>_>_>
               *)&local_60);
  Registry::get_timers_abi_cxx11_
            ((MMap<Timer> *)&local_60,
             (this->m_registry).super___shared_ptr<cppmetrics::Registry,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    do {
      Timer::get_snapshot((Timer *)&local_70);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (this->m_output,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,".count\t",7);
      Timer::get_count(*(Timer **)(p_Var2 + 2));
      poVar1 = std::ostream::_M_insert<long>((long)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (this->m_output,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,".m1\t",4);
      dVar3 = Timer::get_m1_rate(*(Timer **)(p_Var2 + 2));
      poVar1 = std::ostream::_M_insert<double>(dVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (this->m_output,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,".m5\t",4);
      dVar3 = Timer::get_m5_rate(*(Timer **)(p_Var2 + 2));
      poVar1 = std::ostream::_M_insert<double>(dVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (this->m_output,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,".m15\t",5);
      dVar3 = Timer::get_m15_rate(*(Timer **)(p_Var2 + 2));
      poVar1 = std::ostream::_M_insert<double>(dVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (this->m_output,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,".p75\t",5);
      dVar3 = (double)(**(code **)(*(long *)local_70.m_counter.super___atomic_base<long>._M_i + 0x50
                                  ))();
      poVar1 = std::ostream::_M_insert<double>(dVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (this->m_output,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,".p95\t",5);
      dVar3 = (double)(**(code **)(*(long *)local_70.m_counter.super___atomic_base<long>._M_i + 0x58
                                  ))();
      poVar1 = std::ostream::_M_insert<double>(dVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (this->m_output,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,".p99\t",5);
      dVar3 = (double)(**(code **)(*(long *)local_70.m_counter.super___atomic_base<long>._M_i + 0x68
                                  ))();
      poVar1 = std::ostream::_M_insert<double>(dVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      if ((_Head_base<0UL,_cppmetrics::Reservoir_*,_false>)
          local_70.m_reservoir._M_t.
          super___uniq_ptr_impl<cppmetrics::Reservoir,_std::default_delete<cppmetrics::Reservoir>_>.
          _M_t.
          super__Tuple_impl<0UL,_cppmetrics::Reservoir_*,_std::default_delete<cppmetrics::Reservoir>_>
          .super__Head_base<0UL,_cppmetrics::Reservoir_*,_false>._M_head_impl !=
          (_Head_base<0UL,_cppmetrics::Reservoir_*,_false>)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_70.m_reservoir._M_t.
                   super___uniq_ptr_impl<cppmetrics::Reservoir,_std::default_delete<cppmetrics::Reservoir>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cppmetrics::Reservoir_*,_std::default_delete<cppmetrics::Reservoir>_>
                   .super__Head_base<0UL,_cppmetrics::Reservoir_*,_false>._M_head_impl);
      }
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>_>_>_>
               *)&local_60);
  return;
}

Assistant:

void OStreamReporter::report()
{
  for (auto&& counter : m_registry->get_counters())
  {
    m_output << counter.first << "\t" << counter.second->get_count() << "\n";
  }

  for (auto&& gauge : m_registry->get_gauges())
  {
    //m_output << counter.first << "\t" << counter.second->
  }

  for (auto&& meter : m_registry->get_meters())
  {
    m_output << meter.first << ".count\t" << meter.second->get_count() << "\n";
    m_output << meter.first << ".mean\t" << meter.second->get_mean_rate() << "\n";
    m_output << meter.first << ".m1\t" << meter.second->get_m1_rate() << "\n";
    m_output << meter.first << ".m5\t" << meter.second->get_m5_rate() << "\n";
    m_output << meter.first << ".m15\t" << meter.second->get_m15_rate() << "\n";
  }

  for (auto&& histogram : m_registry->get_histograms())
  {
    auto snapshot = histogram.second->get_snapshot();
    m_output << histogram.first << ".count\t" << histogram.second->get_count() << "\n";
    m_output << histogram.first << ".p75\t" << snapshot->get_p75() << "\n";
    m_output << histogram.first << ".p95\t" << snapshot->get_p95() << "\n";
    m_output << histogram.first << ".p99\t" << snapshot->get_p99() << "\n";
  }

  for (auto&& timer : m_registry->get_timers())
  {
    auto snapshot = timer.second->get_snapshot();
    m_output << timer.first << ".count\t" << timer.second->get_count() << "\n";
    m_output << timer.first << ".m1\t" << timer.second->get_m1_rate() << "\n";
    m_output << timer.first << ".m5\t" << timer.second->get_m5_rate() << "\n";
    m_output << timer.first << ".m15\t" << timer.second->get_m15_rate() << "\n";
    m_output << timer.first << ".p75\t" << snapshot->get_p75() << "\n";
    m_output << timer.first << ".p95\t" << snapshot->get_p95() << "\n";
    m_output << timer.first << ".p99\t" << snapshot->get_p99() << "\n";
  }
}